

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fReadPixelsTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ReadPixelsTest::ReadPixelsTest
          (ReadPixelsTest *this,Context *context,char *name,char *description,int flags,
          int alignment,GLint rowLength,GLint skipRows,GLint skipPixels,GLenum format,GLenum type)

{
  deUint32 dVar1;
  int alignment_local;
  int flags_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ReadPixelsTest_conflict *this_local;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ReadPixelsTest_032a95b0;
  dVar1 = deStringHash(name);
  (this->m_random).m_rnd.x = dVar1;
  *(bool *)&(this->m_random).m_rnd.y = (flags & 1U) != 0;
  *(bool *)((long)&(this->m_random).m_rnd.y + 1) = (flags & 2U) != 0;
  (this->m_random).m_rnd.z = alignment;
  (this->m_random).m_rnd.w = rowLength;
  *(GLint *)&this->m_log = skipRows;
  *(GLint *)((long)&this->m_log + 4) = skipPixels;
  *(GLenum *)&this->m_program = format;
  *(GLenum *)((long)&this->m_program + 4) = type;
  this->m_framebuffeType = 0xd;
  this->m_renderbufferFormat = 0xd;
  return;
}

Assistant:

ReadPixelsTest::ReadPixelsTest	(Context& context, const char* name, const char* description, int flags, int alignment, GLint rowLength, GLint skipRows, GLint skipPixels, GLenum format, GLenum type)
	: TestCase			(context, name, description)
	, m_seed			(deStringHash(name))
	, m_chooseFormat	((flags & FLAG_CHOOSE_FORMAT) != 0)
	, m_useRenderBuffer	((flags & FLAG_USE_RBO) != 0)
	, m_alignment		(alignment)
	, m_rowLength		(rowLength)
	, m_skipRows		(skipRows)
	, m_skipPixels		(skipPixels)
	, m_format			(format)
	, m_type			(type)
	, m_width			(13)
	, m_height			(13)
{
}